

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

void __thiscall cmCTestP4::DescribeParser::NextSection(DescribeParser *this)

{
  Revision local_110;
  DescribeParser *local_10;
  DescribeParser *this_local;
  
  if (this->Section == SectionDiff) {
    local_10 = this;
    (*(this->P4->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[8])
              (this->P4,&this->Rev,&this->Changes);
    memset(&local_110,0,0x100);
    cmCTestVC::Revision::Revision(&local_110);
    cmCTestVC::Revision::operator=(&this->Rev,&local_110);
    cmCTestVC::Revision::~Revision(&local_110);
  }
  this->Section = (int)(this->Section + SectionBody) % 4;
  return;
}

Assistant:

void NextSection()
    {
    if(this->Section == SectionDiff)
    {
      this->P4->DoRevision(this->Rev, this->Changes);
      this->Rev = Revision();
    }

    this->Section = SectionType((this->Section+1) % SectionCount);
    }